

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

AppendResult __thiscall
metaf::WindGroup::appendWindShift(WindGroup *this,string *group,ReportMetadata *reportMetadata)

{
  uint uVar1;
  bool bVar2;
  optional<unsigned_int> oVar3;
  
  bVar2 = std::operator==(group,"FROPA");
  if (bVar2) {
    this->windType = WIND_SHIFT_FROPA;
  }
  else {
    if (((this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) != 0) {
      return NOT_APPENDED;
    }
    if ((group->_M_string_length == 2 &
        (reportMetadata->reportTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged) == 1) {
      oVar3 = strToUint(group,0,2);
      if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        return NOT_APPENDED;
      }
      uVar1 = (reportMetadata->reportTime).super__Optional_base<metaf::MetafTime,_true,_true>.
              _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.
              hourValue;
      *(undefined1 *)
       ((long)&(this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 4) = 0;
      (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue = uVar1;
      (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue =
           oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
    }
    else {
      if (group->_M_string_length != 4) {
        return NOT_APPENDED;
      }
      oVar3 = strToUint(group,0,4);
      if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        return NOT_APPENDED;
      }
      *(undefined1 *)
       ((long)&(this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 4) = 0;
      (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue =
           (uint)(((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0xffffffff) / 100);
      (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue =
           (uint)(((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0xffffffff) % 100);
    }
    if ((this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged == false) {
      (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = true;
    }
  }
  return APPENDED;
}

Assistant:

AppendResult WindGroup::appendWindShift(const std::string & group,
	const ReportMetadata & reportMetadata)
{
	//Append FROPA to wind shift group with or without time
	if (group == "FROPA") {
		windType = Type::WIND_SHIFT_FROPA;
		return AppendResult::APPENDED;
	}
	if (eventTime().has_value()) return AppendResult::NOT_APPENDED;
	//Append 2-digit time to WSHFT
	if (!eventTime().has_value() &&
		reportMetadata.reportTime.has_value() &&
		group.length() == 2)
	{
		const auto minuteVal = strToUint(group, 0, 2);
		if (!minuteVal.has_value()) return AppendResult::NOT_APPENDED;
		evTime = MetafTime(reportMetadata.reportTime->hour(), *minuteVal);
		return AppendResult::APPENDED;
	}
	//Append 4-digit time to WSHFT
	if (!eventTime().has_value() && group.length() == 4)
	{
		const auto hourMinuteVal = strToUint(group, 0, 4);
		if (!hourMinuteVal.has_value()) return AppendResult::NOT_APPENDED;
		// hourMinuteVal.value() has 4 digits, format hhmm
		const auto hour = *hourMinuteVal / 100;
		const auto minute = *hourMinuteVal % 100;
		evTime = MetafTime (hour, minute);
		return AppendResult::APPENDED;
	}
	return AppendResult::NOT_APPENDED;
}